

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRDataQueue.cpp
# Opt level: O1

void __thiscall
MinVR::VRDataQueue::addSerializedQueue(VRDataQueue *this,serialData *serializedQueue)

{
  longlong timeStamp_00;
  ulong uVar1;
  VRError *this_00;
  int iVar2;
  int numIncluded;
  longlong timeStamp;
  string local_248;
  int local_228;
  int local_224;
  VRDataQueue *local_220;
  longlong local_218;
  serialData local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0 [3];
  ios_base local_138 [264];
  
  if (0x11 < serializedQueue->_M_string_length) {
    local_220 = this;
    uVar1 = std::__cxx11::string::find((char *)serializedQueue,0x13728b,0x12);
    std::__cxx11::string::substr((ulong)&local_248,(ulong)serializedQueue);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_1b0,(string *)&local_248,_S_in);
    std::istream::operator>>((istream *)local_1b0,&local_224);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    uVar1 = std::__cxx11::string::find((char *)serializedQueue,0x13d577,uVar1);
    uVar1 = std::__cxx11::string::find((char *)serializedQueue,0x13d559,uVar1);
    if (uVar1 == 0xffffffffffffffff) {
      iVar2 = 0;
    }
    else {
      iVar2 = 0;
      do {
        uVar1 = std::__cxx11::string::find((char *)serializedQueue,0x13d576,uVar1);
        std::__cxx11::string::substr((ulong)&local_248,(ulong)serializedQueue);
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)local_1b0,(string *)&local_248,_S_in);
        std::istream::_M_extract<long_long>((longlong *)local_1b0);
        std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
        std::ios_base::~ios_base(local_138);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != &local_248.field_2) {
          operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::find((char *)serializedQueue,0x13d579,uVar1);
        timeStamp_00 = local_218;
        std::__cxx11::string::substr((ulong)&local_210,(ulong)serializedQueue);
        push(local_220,timeStamp_00,&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_210._M_dataplus._M_p != &local_210.field_2) {
          operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
        }
        iVar2 = iVar2 + 1;
        uVar1 = std::__cxx11::string::find((char *)serializedQueue,0x13d559,uVar1);
      } while (uVar1 != 0xffffffffffffffff);
    }
    if (iVar2 != local_224) {
      this_00 = (VRError *)__cxa_allocate_exception(0xa8);
      local_1b0[0]._M_dataplus._M_p = (pointer)&local_1b0[0].field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Serialized queue appears corrupted.","");
      local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"");
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/MinVR[P]MinVR/src/config/VRDataQueue.cpp"
                 ,"");
      local_228 = 0x3b;
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_1f0,
                 "void MinVR::VRDataQueue::addSerializedQueue(const VRDataQueue::serialData)","");
      VRError::VRError(this_00,local_1b0,&local_248,&local_1d0,&local_228,&local_1f0);
      __cxa_throw(this_00,&VRError::typeinfo,VRError::~VRError);
    }
  }
  return;
}

Assistant:

void VRDataQueue::addSerializedQueue(const VRDataQueue::serialData serializedQueue) {

  // Looking for the number in <VRDataQueue num="X">
  if (serializedQueue.size() < 18) return;

  std::size_t start, end;

  start = 18;
  end = serializedQueue.find("\"", start);

  //std::cout << serializedQueue.substr(start, end - start) << std::endl;

  int numIncluded;
  std::istringstream( serializedQueue.substr(start,end)) >> numIncluded;
  start = serializedQueue.find(">", end);

  // Found the number of items.  Now parse the items, making sure to
  // record the timeStamp of each one.

  int numReceived = 0;
  long long timeStamp;
  start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", start);
  while (start != std::string::npos) {

    end = serializedQueue.find("\">", start);
    // These constants have to do with the length of the tags used to
    // encode a queue.
    std::istringstream(serializedQueue.substr(start + 28, end - start - 28)) >>
      timeStamp;

    start = serializedQueue.find("</VRDataQueueItem>", end);
    push(timeStamp, serializedQueue.substr(end + 2, start - end - 2) );
    numReceived++;
    start = serializedQueue.find("<VRDataQueueItem timeStamp=\"", end);
  }

  if (numReceived != numIncluded) {
    VRERRORNOADV("Serialized queue appears corrupted.");
  }
}